

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

float __thiscall nv::LanczosFilter::evaluate(LanczosFilter *this,float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (ABS(x) < 3.0) {
    fVar2 = ABS(x) * 3.1415927;
    if (0.0001 <= fVar2) {
      fVar3 = sinf(fVar2);
      fVar3 = fVar3 / fVar2;
    }
    else {
      fVar3 = ((fVar2 * fVar2) / 120.0 + -0.16666667) * fVar2 * fVar2 + 1.0;
    }
    fVar2 = fVar2 / 3.0;
    if (0.0001 <= fVar2) {
      fVar1 = sinf(fVar2);
      fVar1 = fVar1 / fVar2;
    }
    else {
      fVar1 = ((fVar2 * fVar2) / 120.0 + -0.16666667) * fVar2 * fVar2 + 1.0;
    }
    fVar3 = fVar3 * fVar1;
  }
  return fVar3;
}

Assistant:

float LanczosFilter::evaluate(float x) const
{
	x = fabs(x);
	if( x < 3.0f ) return sincf(PI * x) * sincf(PI * x / 3.0f);
	return 0.0f;
}